

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::computeMLResidual(MLMG *this,int amrlevmax)

{
  pointer pAVar1;
  pointer pVVar2;
  pointer pAVar3;
  long lVar4;
  long local_38;
  
  local_38 = (ulong)(amrlevmax + 1) * 0x18;
  lVar4 = (ulong)(amrlevmax + 1) << 3;
  while (-1 < amrlevmax) {
    pAVar1 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar3 = pAVar1 + ((ulong)(uint)amrlevmax - 1);
    if (amrlevmax == 0) {
      pAVar3 = (pointer)0x0;
    }
    (*this->linop->_vptr_MLLinOp[0x34])
              (this->linop,(ulong)(uint)amrlevmax,
               *(undefined8 *)
                &(this->res).
                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(uint)amrlevmax].
                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,
               pAVar1 + (uint)amrlevmax,
               (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start + (uint)amrlevmax,pAVar3);
    if (amrlevmax < this->finest_amr_lev) {
      pVVar2 = (this->res).
               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar1 = (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*this->linop->_vptr_MLLinOp[0x36])
                (this->linop,(ulong)(uint)amrlevmax,
                 *(undefined8 *)
                  &pVVar2[(uint)amrlevmax].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,
                 pAVar3 + (uint)amrlevmax,pAVar1 + (uint)amrlevmax,
                 *(undefined8 *)
                  ((long)&(pVVar2->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + local_38),
                 (long)&(pAVar3->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar4,(long)&(pAVar1->m_ptr)._M_t.
                              super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl
                       + lVar4);
    }
    lVar4 = lVar4 + -8;
    local_38 = local_38 + -0x18;
    amrlevmax = amrlevmax - 1;
  }
  return;
}

Assistant:

void
MLMG::computeMLResidual (int amrlevmax)
{
    BL_PROFILE("MLMG::computeMLResidual()");

    const int mglev = 0;
    for (int alev = amrlevmax; alev >= 0; --alev) {
        const Any* crse_bcdata = (alev > 0) ? &(sol[alev-1]) : nullptr;
        linop.AnySolutionResidual(alev, res[alev][mglev], sol[alev], rhs[alev], crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.AnyReflux(alev, res[alev][mglev], sol[alev], rhs[alev],
                            res[alev+1][mglev], sol[alev+1], rhs[alev+1]);
        }
    }
}